

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_metadata_info.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::PragmaMetadataInfoBind
          (duckdb *this,ClientContext *context,TableFunctionBindInput *input,
          vector<duckdb::LogicalType,_true> *return_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<duckdb::Value,_true> *this_00;
  reference pvVar2;
  Catalog *pCVar3;
  pointer pPVar4;
  BinderException *this_01;
  string db_name;
  _Head_base<0UL,_duckdb::PragmaMetadataFunctionData_*,_false> local_90;
  string local_88;
  undefined1 local_68 [32];
  vector<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_> local_48;
  
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[9]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [9])"block_id");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BIGINT);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[13]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [13])"total_blocks");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BIGINT);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[12]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [12])"free_blocks");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BIGINT);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[10]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [10])"free_list");
  LogicalType::LogicalType((LogicalType *)local_68,BIGINT);
  LogicalType::LIST((LogicalType *)&local_88,(LogicalType *)local_68);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
  emplace_back<duckdb::LogicalType>
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)return_types,
             (LogicalType *)&local_88);
  LogicalType::~LogicalType((LogicalType *)&local_88);
  LogicalType::~LogicalType((LogicalType *)local_68);
  paVar1 = &local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  this_00 = input->inputs;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  if ((this_00->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this_00->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    DatabaseManager::GetDefaultDatabase_abi_cxx11_(context);
  }
  else {
    pvVar2 = vector<duckdb::Value,_true>::operator[](this_00,0);
    if (pvVar2->is_null == true) {
      this_01 = (BinderException *)__cxa_allocate_exception(0x10);
      local_68._0_8_ = local_68 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_68,"Database argument for pragma_metadata_info cannot be NULL","");
      BinderException::BinderException(this_01,(string *)local_68);
      __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar2 = vector<duckdb::Value,_true>::operator[](input->inputs,0);
    StringValue::Get_abi_cxx11_(pvVar2);
  }
  ::std::__cxx11::string::_M_assign((string *)&local_88);
  pCVar3 = Catalog::GetCatalog(context,&local_88);
  local_90._M_head_impl = (PragmaMetadataFunctionData *)operator_new(0x38);
  ((local_90._M_head_impl)->super_TableFunctionData).column_ids.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ((local_90._M_head_impl)->super_TableFunctionData).column_ids.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ((local_90._M_head_impl)->super_TableFunctionData).column_ids.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ((local_90._M_head_impl)->super_TableFunctionData).super_FunctionData._vptr_FunctionData =
       (_func_int **)&PTR__PragmaMetadataFunctionData_024527f0;
  ((local_90._M_head_impl)->metadata_info).
  super_vector<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>.
  super__Vector_base<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_90._M_head_impl)->metadata_info).
  super_vector<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>.
  super__Vector_base<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_90._M_head_impl)->metadata_info).
  super_vector<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>.
  super__Vector_base<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*pCVar3->_vptr_Catalog[0x14])(&local_48,pCVar3,context);
  pPVar4 = unique_ptr<duckdb::PragmaMetadataFunctionData,_std::default_delete<duckdb::PragmaMetadataFunctionData>,_true>
           ::operator->((unique_ptr<duckdb::PragmaMetadataFunctionData,_std::default_delete<duckdb::PragmaMetadataFunctionData>,_true>
                         *)&local_90);
  local_68._16_8_ =
       (pPVar4->metadata_info).
       super_vector<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>.
       super__Vector_base<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (pPVar4->metadata_info).
  super_vector<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>.
  super__Vector_base<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_48.
       super__Vector_base<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68._0_8_ =
       (pPVar4->metadata_info).
       super_vector<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>.
       super__Vector_base<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_68._8_8_ =
       (pPVar4->metadata_info).
       super_vector<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>.
       super__Vector_base<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (pPVar4->metadata_info).
  super_vector<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>.
  super__Vector_base<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_48.
       super__Vector_base<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (pPVar4->metadata_info).
  super_vector<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>.
  super__Vector_base<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_48.
       super__Vector_base<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>::~vector
            ((vector<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_> *)
             local_68);
  ::std::vector<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>::~vector
            (&local_48);
  *(PragmaMetadataFunctionData **)this = local_90._M_head_impl;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> PragmaMetadataInfoBind(ClientContext &context, TableFunctionBindInput &input,
                                                       vector<LogicalType> &return_types, vector<string> &names) {
	names.emplace_back("block_id");
	return_types.emplace_back(LogicalType::BIGINT);

	names.emplace_back("total_blocks");
	return_types.emplace_back(LogicalType::BIGINT);

	names.emplace_back("free_blocks");
	return_types.emplace_back(LogicalType::BIGINT);

	names.emplace_back("free_list");
	return_types.emplace_back(LogicalType::LIST(LogicalType::BIGINT));

	string db_name;
	if (input.inputs.empty()) {
		db_name = DatabaseManager::GetDefaultDatabase(context);
	} else {
		if (input.inputs[0].IsNull()) {
			throw BinderException("Database argument for pragma_metadata_info cannot be NULL");
		}
		db_name = StringValue::Get(input.inputs[0]);
	}
	auto &catalog = Catalog::GetCatalog(context, db_name);
	auto result = make_uniq<PragmaMetadataFunctionData>();
	result->metadata_info = catalog.GetMetadataInfo(context);
	return std::move(result);
}